

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall
lzham::lzcompressor::compress_block_internal(lzcompressor *this,void *pBuf,uint buf_len)

{
  state *this_00;
  uint8 *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  lzdecision *plVar7;
  lzdecision *plVar8;
  undefined4 uVar10;
  undefined4 uVar11;
  uchar *puVar9;
  undefined4 uVar12;
  symbol_codec *psVar13;
  search_accelerator *dict;
  parse_thread_state *ppVar14;
  bool bVar15;
  char cVar16;
  uint temp;
  uint uVar17;
  undefined4 uVar18;
  int iVar19;
  ulong uVar20;
  undefined8 uVar21;
  int *piVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  byte bVar26;
  void *pData_ptr;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pData_ptr_00;
  void *extraout_RDX_01;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  long lVar33;
  uint64 data;
  sem_t *psVar34;
  lzdecision lzdec;
  lzdecision lzdec_00;
  lzdecision lzdec_01;
  uint cur_dict_ofs;
  uint bytes_to_match;
  parse_thread_state *greedy_parse_state;
  uint local_10c;
  uint local_108;
  byte local_101;
  state *local_100;
  uint local_f4;
  ulong local_f0;
  symbol_codec *local_e8;
  search_accelerator *local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  sem_t *local_b8;
  long local_b0;
  uint local_a8;
  uint local_a4;
  ulong local_a0;
  uint *local_98;
  void *local_90;
  state *local_88;
  parse_thread_state *local_80;
  state *local_78;
  long local_70;
  parse_thread_state *local_68;
  state *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (this->m_src_size < 0) {
    return false;
  }
  uVar25 = (ulong)buf_len;
  this->m_src_size = this->m_src_size + uVar25;
  local_e0 = &this->m_accel;
  local_c0 = uVar25;
  local_90 = pBuf;
  bVar15 = search_accelerator::add_bytes_begin(local_e0,buf_len,(uint8 *)pBuf);
  if (bVar15) {
    local_100 = &this->m_state;
    local_78 = &this->m_start_of_block_state;
    state::operator=(local_78,local_100);
    uVar27 = (this->m_accel).m_max_dict_size - 1 & (this->m_accel).m_lookahead_pos;
    this->m_block_start_dict_ofs = uVar27;
    uVar28 = (uint)&this->m_codec;
    local_10c = uVar27;
    local_108 = buf_len;
    local_a0 = uVar25;
    cVar16 = lzham::symbol_codec::start_encoding(uVar28);
    if (((cVar16 != '\0') && (cVar16 = lzham::symbol_codec::encode_bits(uVar28,1), cVar16 != '\0'))
       && (local_e8 = &this->m_codec, cVar16 = lzham::symbol_codec::encode_arith_init(),
          cVar16 != '\0')) {
      state::start_of_block(local_100,local_e0,uVar27,this->m_block_index);
      uVar27 = (this->m_params).m_lzham_compress_flags & 0x10;
      if (uVar27 != 0) {
        state::reset_update_rate(local_100);
      }
      lzham::symbol_codec::encode_bits((uint)local_e8,uVar27 >> 4);
      local_a8 = this->m_step;
      if (local_108 != 0) {
        local_80 = this->m_parse_thread_state + 8;
        local_88 = &this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state;
        local_98 = (this->m_state).super_state_base.m_match_hist;
        local_68 = this->m_parse_thread_state;
        local_60 = &this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state;
        local_b8 = (sem_t *)&this->m_parse_thread_state[1].super_raw_parse_thread_state.m_finished;
        local_d8 = 0;
        do {
          uVar29 = local_108;
          if ((local_108 < 0x180) || ((this->m_params).m_pSeed_bytes == (void *)0x0)) {
LAB_00109aa4:
            pData_ptr = (void *)0xaaaaaaab;
            uVar27 = (local_108 + 0xbff) / 0xc00;
            if (this->m_num_parse_threads < uVar27) {
              uVar27 = this->m_num_parse_threads;
            }
            uVar28 = (this->m_params).m_lzham_compress_flags;
            if ((((uVar28 & 4) == 0) && (this->m_use_task_pool == true)) &&
               ((this->m_accel).m_max_helper_threads != 0)) {
              uVar27 = uVar27 + (int)(this->m_accel).m_num_completed_helper_threads;
              pData_ptr = (void *)0x8;
              if (7 < uVar27) {
                uVar27 = 8;
              }
            }
            local_f0 = (ulong)uVar27;
            if ((uVar28 & 0x40) != 0) {
              local_f0 = 1;
            }
            if (local_108 < 0x600) {
              local_f0 = 1;
            }
            if ((this->m_block_index == 0) && (local_10c - this->m_block_start_dict_ofs < 0x3000)) {
              local_f0 = 1;
            }
            iVar19 = (int)local_f0;
            uVar27 = iVar19 * 0xc00;
            if (local_108 < (uint)(iVar19 * 0xc00)) {
              uVar27 = local_108;
            }
            local_c8 = CONCAT44(local_c8._4_4_,uVar27);
            if (iVar19 == 1) {
              local_58._0_4_ = (local_100->super_state_base).m_cur_ofs;
              local_58._4_4_ = (local_100->super_state_base).m_cur_state;
              uStack_50 = 0;
              local_48 = *(undefined8 *)local_98;
              uStack_40 = *(undefined8 *)(local_98 + 2);
            }
            local_d0 = local_f0;
            if (iVar19 != 0) {
              lVar33 = local_f0 * 0x156800;
              lVar32 = 0;
              uVar28 = local_10c;
              do {
                if ((uint)local_f0 == 1) {
                  *(state **)
                   ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes[0].
                          m_node_states[0].m_saved_state.m_match_hist + lVar32 + 0xffffffffffffffdcU
                   ) = local_100;
                }
                else {
                  this_00 = (state *)((long)(local_60->super_state_base).m_match_hist + lVar32 + -8)
                  ;
                  *(state **)
                   ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes[0].
                          m_node_states[0].m_saved_state.m_match_hist + lVar32 + 0xffffffffffffffdcU
                   ) = this_00;
                  state::operator=(this_00,local_100);
                  pData_ptr = extraout_RDX;
                }
                **(uint **)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_nodes
                                  [0].m_node_states[0].m_saved_state.m_match_hist +
                           lVar32 + 0xffffffffffffffdcU) = uVar28;
                if (lVar32 != 0) {
                  state::reset_state_partial
                            (*(state **)
                              ((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                     m_nodes[0].m_node_states[0].m_saved_state.m_match_hist +
                              lVar32 + 0xffffffffffffffdcU));
                  pData_ptr = extraout_RDX_00;
                }
                this->m_parse_thread_state[0].m_unused_alignment_array[lVar32 + -0x23] = lVar32 != 0
                ;
                *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state.
                                super_state_base.m_match_hist + lVar32 + -0x10) = uVar28;
                uVar30 = uVar27;
                if ((ulong)(iVar19 - 1) * 0x156800 - lVar32 != 0) {
                  uVar30 = (uint)local_c8 / (uint)local_f0;
                  pData_ptr = (void *)((local_c8 & 0xffffffff) % (local_f0 & 0xffffffff));
                }
                if (0xbff < uVar30) {
                  uVar30 = 0xc00;
                }
                *(uint *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.m_state.
                                super_state_base.m_match_hist + lVar32 + -0xc) = uVar30;
                *(uint *)(this->m_parse_thread_state[0].m_unused_alignment_array + lVar32 + -0x38) =
                     (this->m_params).m_extreme_parsing_max_best_arrivals;
                puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar32 + -0x34;
                puVar1[0] = 0xff;
                puVar1[1] = 0xff;
                puVar1[2] = 0xff;
                puVar1[3] = 0xff;
                this->m_parse_thread_state[0].m_unused_alignment_array[lVar32 + -0x24] = '\0';
                puVar1 = this->m_parse_thread_state[0].m_unused_alignment_array + lVar32 + -0x2c;
                puVar1[0] = 0xff;
                puVar1[1] = 0xff;
                puVar1[2] = 0xff;
                puVar1[3] = 0xff;
                puVar1[4] = '\0';
                puVar1[5] = '\0';
                puVar1[6] = '\0';
                puVar1[7] = '\0';
                bVar26 = (uint)local_f0 != 1 & this->m_use_task_pool & lVar32 != 0;
                pData_ptr = (void *)CONCAT71((int7)((ulong)pData_ptr >> 8),bVar26);
                this->m_parse_thread_state[0].m_unused_alignment_array[lVar32 + -0x21] = bVar26;
                if (((uint)local_f0 == 1) &&
                   ((this->m_params).m_compression_level == cCompressionLevelUber)) {
                  uVar18 = 0x10;
                  if (((this->m_params).m_lzham_compress_flags & 2) == 0) {
                    uVar18 = 0x40;
                  }
                  *(undefined4 *)
                   (this->m_parse_thread_state[0].m_unused_alignment_array + lVar32 + -0x2c) =
                       uVar18;
                }
                iVar4 = *(int *)((long)this->m_parse_thread_state[0].super_raw_parse_thread_state.
                                       m_state.super_state_base.m_match_hist + lVar32 + -0xc);
                uVar28 = uVar28 + iVar4;
                uVar27 = uVar27 - iVar4;
                lVar32 = lVar32 + 0x156800;
              } while (lVar33 - lVar32 != 0);
            }
            uVar25 = local_d0;
            uVar28 = (uint)local_f0;
            if ((uVar28 < 2) || (this->m_use_task_pool == false)) {
              if (uVar28 != 0) {
                data = 0;
                do {
                  parse_job_callback(this,data,pData_ptr);
                  data = data + 1;
                  pData_ptr = extraout_RDX_01;
                } while (uVar25 != data);
              }
            }
            else {
              bVar15 = task_pool::
                       queue_multiple_object_tasks<lzham::lzcompressor,void(lzham::lzcompressor::*)(unsigned_long_long,void*)>
                                 ((this->m_params).m_pTask_pool,this,
                                  (offset_in_lzcompressor_to_subr)parse_job_callback,0,1,
                                  (void *)(ulong)(uVar28 - 1));
              uVar25 = local_d0;
              uVar27 = 1;
              if (!bVar15) goto LAB_0010a09c;
              parse_job_callback(this,0,pData_ptr_00);
            }
            if (uVar28 == 1) {
              (local_100->super_state_base).m_cur_ofs = (undefined4)local_58;
              (local_100->super_state_base).m_cur_state = local_58._4_4_;
              *(undefined8 *)local_98 = local_48;
              *(undefined8 *)(local_98 + 2) = uStack_40;
            }
            if ((local_d8 & 1) == 0) {
              uVar21 = lzham::adler32(local_90,local_c0,this->m_src_adler32);
              this->m_src_adler32 = (uint32)uVar21;
              local_d8 = CONCAT71((int7)((ulong)uVar21 >> 8),1);
            }
            uVar27 = 0x10;
            bVar26 = uVar28 != 0;
            if (uVar28 == 0) {
              uVar29 = 0;
            }
            else {
              local_b0 = uVar25 - 1;
              uVar25 = 0;
              local_f4 = 0;
              do {
                local_101 = bVar26;
                ppVar14 = local_68;
                local_c8 = uVar25;
                if (local_68[uVar25].super_raw_parse_thread_state.m_use_semaphore == true) {
                  iVar19 = sem_wait((sem_t *)&local_68[uVar25].super_raw_parse_thread_state.
                                              m_finished);
                  if ((iVar19 != 0) && (piVar22 = __errno_location(), *piVar22 != 0x6e)) {
                    lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                               "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                               ,0xb6);
                  }
                  ppVar14[uVar25].super_raw_parse_thread_state.m_use_semaphore = false;
                }
                if (ppVar14[uVar25].super_raw_parse_thread_state.m_failed == true) {
                  psVar34 = local_b8;
                  lVar32 = local_b0;
                  if ((uint)local_f0 != 1) {
                    do {
                      if (*(char *)((long)psVar34 + -1) == '\x01') {
                        iVar19 = sem_wait(psVar34);
                        if ((iVar19 != 0) && (piVar22 = __errno_location(), *piVar22 != 0x6e)) {
                          lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                     ,0xb6);
                        }
                        *(undefined1 *)((long)psVar34 + -1) = 0;
                      }
                      lVar32 = lVar32 + -1;
                      psVar34 = psVar34 + 0xab40;
                    } while (lVar32 != 0);
                  }
LAB_00109e59:
                  bVar15 = false;
                }
                else {
                  if (ppVar14[uVar25].super_raw_parse_thread_state.m_issue_reset_state_partial ==
                      true) {
                    bVar15 = state::encode_reset_state_partial
                                       (local_100,local_e8,local_e0,local_10c);
                    if (!bVar15) {
                      psVar34 = local_b8;
                      lVar32 = local_b0;
                      if ((uint)local_f0 != 1) {
                        do {
                          if (*(char *)((long)psVar34 + -1) == '\x01') {
                            iVar19 = sem_wait(psVar34);
                            if ((iVar19 != 0) && (piVar22 = __errno_location(), *piVar22 != 0x6e)) {
                              lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                         ,0xb6);
                            }
                            *(undefined1 *)((long)psVar34 + -1) = 0;
                          }
                          lVar32 = lVar32 + -1;
                          psVar34 = psVar34 + 0xab40;
                        } while (lVar32 != 0);
                      }
                      goto LAB_00109e59;
                    }
                    this->m_step = this->m_step + 1;
                  }
                  uVar29 = ppVar14[uVar25].super_raw_parse_thread_state.m_best_decisions.m_size;
                  if (uVar29 == 0) {
                    bVar15 = true;
                  }
                  else {
                    uVar27 = uVar29 - 1;
                    bVar2 = ppVar14[uVar25].super_raw_parse_thread_state.m_emit_decisions_backwards;
                    uVar24 = (ulong)bVar2;
                    local_a4 = uVar27;
                    if (bVar2 != false) {
                      local_a4 = 0;
                      uVar24 = (ulong)uVar27;
                    }
                    plVar8 = ppVar14[uVar25].super_raw_parse_thread_state.m_best_decisions.m_p;
                    local_70 = uVar24 * 3;
                    plVar7 = plVar8 + uVar24;
                    uVar5 = plVar7->m_pos;
                    uVar10 = plVar7->m_len;
                    lzdec_00.m_len = uVar10;
                    lzdec_00.m_pos = uVar5;
                    lzdec_00.m_dist = plVar8[uVar24].m_dist;
                    bVar15 = code_decision(this,lzdec_00,&local_10c,&local_108);
                    if (bVar15) {
                      iVar19 = (&(ppVar14[uVar25].super_raw_parse_thread_state.m_best_decisions.m_p)
                                 ->m_len)[local_70];
                      local_f4 = local_f4 + iVar19 + (uint)(iVar19 == 0);
                      if (uVar27 != 0) {
                        do {
                          uVar27 = (int)uVar24 + (-(uint)bVar2 | 1);
                          uVar24 = (ulong)uVar27;
                          plVar8 = ppVar14[uVar25].super_raw_parse_thread_state.m_best_decisions.m_p
                          ;
                          plVar7 = plVar8 + uVar24;
                          uVar6 = plVar7->m_pos;
                          uVar11 = plVar7->m_len;
                          lzdec_01.m_len = uVar11;
                          lzdec_01.m_pos = uVar6;
                          lzdec_01.m_dist = plVar8[uVar24].m_dist;
                          bVar15 = code_decision(this,lzdec_01,&local_10c,&local_108);
                          if (!bVar15) goto LAB_00109f98;
                          iVar19 = ppVar14[uVar25].super_raw_parse_thread_state.m_best_decisions.m_p
                                   [uVar24].m_len;
                          local_f4 = local_f4 + iVar19 + (uint)(iVar19 == 0);
                        } while (local_a4 != uVar27);
                      }
                    }
                    else {
LAB_00109f98:
                      lVar32 = local_b0;
                      psVar34 = local_b8;
                      if ((uint)local_f0 != 1) {
                        do {
                          if (*(char *)((long)psVar34 + -1) == '\x01') {
                            iVar19 = sem_wait(psVar34);
                            if ((iVar19 != 0) && (piVar22 = __errno_location(), *piVar22 != 0x6e)) {
                              lzham_fail("\"semaphore: sem_wait() or sem_timedwait() failed\"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/richgel999[P]lzham_codec_devel/lzhamcomp/lzham_pthreads_threading.h"
                                         ,0xb6);
                            }
                            *(undefined1 *)((long)psVar34 + -1) = 0;
                          }
                          lVar32 = lVar32 + -1;
                          psVar34 = psVar34 + 0xab40;
                        } while (lVar32 != 0);
                      }
                    }
                  }
                }
                uVar29 = local_f4;
                if (bVar15 == false) {
                  uVar27 = 1;
                  bVar26 = local_101;
                  goto LAB_0010a08c;
                }
                uVar25 = local_c8 + 1;
                bVar26 = uVar25 < local_d0;
              } while (uVar25 != local_d0);
              uVar27 = 0x10;
            }
LAB_0010a08c:
            if ((bVar26 & 1) == 0) {
              search_accelerator::advance_bytes(local_e0,uVar29);
              uVar27 = 0;
            }
          }
          else {
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_pState = local_88;
            state::operator=(local_88,local_100);
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_state.super_state_base.
            m_cur_ofs = local_10c;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_start_ofs = local_10c;
            uVar17 = 0x10000;
            if (uVar29 < 0x10000) {
              uVar17 = uVar29;
            }
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_to_match = uVar17;
            uVar27 = uVar29 / 0x180;
            if (uVar29 < 0x300) {
              uVar27 = 2;
            }
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_max_greedy_decisions =
                 uVar27;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up =
                 false;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_issue_reset_state_partial =
                 false;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.
            m_greedy_parse_total_bytes_coded = 0;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_parse_early_out_thresh =
                 0xffffffff;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_bytes_actually_parsed = 0;
            this->m_parse_thread_state[8].super_raw_parse_thread_state.m_use_semaphore = false;
            bVar15 = greedy_parse(this,local_80);
            if ((bVar15) ||
               (uVar27 = 1,
               this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up ==
               true)) {
              if (this->m_parse_thread_state[8].super_raw_parse_thread_state.m_greedy_parse_gave_up
                  == true) {
                uVar25 = (ulong)this->m_parse_thread_state[8].super_raw_parse_thread_state.
                                m_best_decisions.m_size;
                uVar28 = 0;
                if (uVar25 == 0) {
                  uVar24 = 0;
                  bVar15 = false;
                  uVar20 = 0;
                }
                else {
                  piVar22 = &(this->m_parse_thread_state[8].super_raw_parse_thread_state.
                              m_best_decisions.m_p)->m_len;
                  uVar23 = 0;
                  uVar30 = 0;
                  uVar20 = 0;
                  uVar27 = 0;
                  do {
                    uVar3 = *piVar22;
                    uVar31 = uVar3 + (uVar3 == 0);
                    if ((uVar3 < 0x102) && (uVar30 = uVar30 + 1, 0x10 < uVar30)) {
                      bVar15 = false;
                    }
                    else {
                      uVar20 = (ulong)((int)uVar20 + uVar31);
                      if (uVar27 <= uVar31) {
                        uVar27 = uVar31;
                      }
                      bVar15 = true;
                    }
                    uVar24 = uVar23;
                    if (!bVar15) break;
                    uVar23 = uVar23 + 1;
                    piVar22 = piVar22 + 3;
                    uVar24 = uVar25;
                  } while (uVar25 != uVar23);
                  bVar15 = 0x101 < uVar27;
                }
                if ((bVar15) &&
                   (uVar28 = (uint)uVar24, (uint)(uVar20 / (uVar24 & 0xffffffff)) < 0x180)) {
                  uVar28 = 0;
                }
              }
              else {
                uVar28 = this->m_parse_thread_state[8].super_raw_parse_thread_state.m_best_decisions
                         .m_size;
              }
              uVar27 = 0;
              if (uVar28 != 0) {
                bVar15 = code_decision(this,*this->m_parse_thread_state[8].
                                             super_raw_parse_thread_state.m_best_decisions.m_p,
                                       &local_10c,&local_108);
                if (bVar15) {
                  lVar32 = 0x14;
                  uVar25 = 1;
                  do {
                    uVar24 = uVar25;
                    iVar19 = *(int *)((long)this->m_parse_thread_state[8].
                                            super_raw_parse_thread_state.m_best_decisions.m_p +
                                     lVar32 + -0x10);
                    search_accelerator::advance_bytes(local_e0,iVar19 + (uint)(iVar19 == 0));
                    if (uVar28 == uVar24) {
                      uVar27 = 7;
                      goto LAB_00109a44;
                    }
                    plVar7 = this->m_parse_thread_state[8].super_raw_parse_thread_state.
                             m_best_decisions.m_p;
                    lzdec.m_dist = *(int *)((long)&plVar7->m_pos + lVar32);
                    lzdec._0_8_ = *(undefined8 *)((long)plVar7 + lVar32 + -8);
                    bVar15 = code_decision(this,lzdec,&local_10c,&local_108);
                    lVar32 = lVar32 + 0xc;
                    uVar25 = uVar24 + 1;
                  } while (bVar15);
                  uVar27 = 1;
LAB_00109a44:
                  bVar15 = uVar24 < uVar28;
                }
                else {
                  uVar27 = 1;
                  bVar15 = true;
                }
                if (!bVar15) {
                  if ((this->m_parse_thread_state[8].super_raw_parse_thread_state.
                       m_greedy_parse_gave_up == true) && (local_108 != 0)) {
                    uVar27 = 0;
                  }
                  else {
                    uVar27 = 2;
                    if ((local_d8 & 1) == 0) {
                      uVar21 = lzham::adler32(local_90,local_c0,this->m_src_adler32);
                      uVar27 = 2;
                      this->m_src_adler32 = (uint32)uVar21;
                      local_d8 = CONCAT71((int7)((ulong)uVar21 >> 8),1);
                    }
                  }
                }
              }
            }
            if (uVar27 == 0) goto LAB_00109aa4;
          }
LAB_0010a09c:
          if ((uVar27 & 0x1d) != 0) {
            return false;
          }
        } while (local_108 != 0);
      }
      dict = local_e0;
      search_accelerator::add_bytes_end(local_e0);
      psVar13 = local_e8;
      bVar15 = state::encode_eob(local_100,local_e8,dict,local_10c);
      if ((bVar15) &&
         (cVar16 = lzham::symbol_codec::stop_encoding(SUB81(psVar13,0)), cVar16 != '\0')) {
        uVar27 = (uint)local_a0;
        if (uVar27 <= *(uint *)&this->field_0x4d0) {
          state::operator=(local_100,local_78);
          psVar13 = local_e8;
          this->m_step = local_a8;
          lzham::symbol_codec::reset();
          uVar28 = (uint)psVar13;
          cVar16 = lzham::symbol_codec::start_encoding(uVar28);
          if (cVar16 == '\0') {
            return false;
          }
          cVar16 = lzham::symbol_codec::encode_bits(uVar28,2);
          if (cVar16 == '\0') {
            return false;
          }
          uVar27 = uVar27 - 1;
          cVar16 = lzham::symbol_codec::encode_bits(uVar28,uVar27);
          if (cVar16 == '\0') {
            return false;
          }
          cVar16 = lzham::symbol_codec::encode_bits
                             (uVar28,(uVar27 >> 0x10 ^ uVar27 >> 8 ^ uVar27) & 0xff);
          if (cVar16 == '\0') {
            return false;
          }
          cVar16 = lzham::symbol_codec::encode_align_to_byte();
          if (cVar16 == '\0') {
            return false;
          }
          if ((int)local_a0 != 0) {
            uVar27 = this->m_block_start_dict_ofs;
            puVar9 = (this->m_accel).m_dict.m_p;
            lVar32 = 0;
            do {
              cVar16 = lzham::symbol_codec::encode_bits
                                 ((uint)local_e8,(uint)puVar9[lVar32 + (ulong)uVar27]);
              if (cVar16 == '\0') {
                return false;
              }
              lVar32 = lVar32 + 1;
            } while ((int)local_c0 != (int)lVar32);
          }
          cVar16 = lzham::symbol_codec::stop_encoding(SUB81(local_e8,0));
          if (cVar16 == '\0') {
            return false;
          }
        }
        if ((this->m_comp_buf).m_size == 0) {
          puVar9 = (this->m_comp_buf).m_p;
          uVar18 = *(undefined4 *)&this->field_0x4d0;
          uVar12 = *(undefined4 *)&this->field_0x4d4;
          uVar29 = (this->m_comp_buf).m_capacity;
          (this->m_comp_buf).m_p = *(uchar **)&this->field_0x4c8;
          (this->m_comp_buf).m_size = uVar18;
          (this->m_comp_buf).m_capacity = uVar12;
          *(uchar **)&this->field_0x4c8 = puVar9;
          *(undefined4 *)&this->field_0x4d0 = 0;
          *(uint *)&this->field_0x4d4 = uVar29;
        }
        else {
          bVar15 = vector<unsigned_char>::append
                             (&this->m_comp_buf,(vector<unsigned_char> *)&this->field_0x4c8);
          if (!bVar15) {
            return false;
          }
        }
        this->m_block_index = this->m_block_index + 1;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool lzcompressor::compress_block_internal(const void* pBuf, uint buf_len)
   {
      scoped_perf_section compress_block_timer(cVarArgs, "****** compress_block %u", m_block_index);

      LZHAM_ASSERT(pBuf);
      LZHAM_ASSERT(buf_len <= m_params.m_block_size);

      LZHAM_ASSERT(m_src_size >= 0);
      if (m_src_size < 0)
         return false;

      m_src_size += buf_len;

      // Important: Don't do any expensive work until after add_bytes_begin() is called, to increase parallelism.
      if (!m_accel.add_bytes_begin(buf_len, static_cast<const uint8*>(pBuf)))
      {
         LZHAM_LOG_ERROR(7047);
         return false;
      }

      bool computed_adler32 = false;

      m_start_of_block_state = m_state;

      m_block_start_dict_ofs = m_accel.get_lookahead_pos() & (m_accel.get_max_dict_size() - 1);

      uint cur_dict_ofs = m_block_start_dict_ofs;

      uint bytes_to_match = buf_len;

      if (!m_codec.start_encoding((buf_len * 9) / 8))
      {
         LZHAM_LOG_ERROR(7048);
         return false;
      }

      if (!m_block_index)
      {
         if (!send_configuration())
         {
            LZHAM_LOG_ERROR(7049);
            return false;
         }
      }

#ifdef LZHAM_LZDEBUG
      m_codec.encode_bits(166, 12);
#endif

      if (!m_codec.encode_bits(cCompBlock, cBlockHeaderBits))
      {
         LZHAM_LOG_ERROR(7050);
         return false;
      }

      if (!m_codec.encode_arith_init())
      {
         LZHAM_LOG_ERROR(7051);
         return false;
      }

      m_state.start_of_block(m_accel, cur_dict_ofs, m_block_index);

      bool emit_reset_update_rate_command = false;

      if (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_TRADEOFF_DECOMPRESSION_RATE_FOR_COMP_RATIO)
      {
         emit_reset_update_rate_command = true;

         m_state.reset_update_rate();
      }

      // TODO: We could also issue a full huff/arith table reset (code 2), and see if that actually improves the block's compression.
      m_codec.encode_bits(emit_reset_update_rate_command ? 1 : 0, cBlockFlushTypeBits);

      //coding_stats initial_stats(m_stats);

      uint initial_step = m_step;

      while (bytes_to_match)
      {
         const uint cAvgAcceptableGreedyMatchLen = 384;
         if ((m_params.m_pSeed_bytes) && (bytes_to_match >= cAvgAcceptableGreedyMatchLen))
         {
            parse_thread_state &greedy_parse_state = m_parse_thread_state[cMaxParseThreads];

            greedy_parse_state.m_pState = &greedy_parse_state.m_state;
            greedy_parse_state.m_state = m_state;
            greedy_parse_state.m_state.m_cur_ofs = cur_dict_ofs;

            greedy_parse_state.m_issue_reset_state_partial = false;
            greedy_parse_state.m_start_ofs = cur_dict_ofs;
            greedy_parse_state.m_bytes_to_match = LZHAM_MIN(bytes_to_match, static_cast<uint>(CLZBase::cMaxHugeMatchLen));

            greedy_parse_state.m_max_greedy_decisions = LZHAM_MAX((bytes_to_match / cAvgAcceptableGreedyMatchLen), 2);
            greedy_parse_state.m_greedy_parse_gave_up = false;
            greedy_parse_state.m_greedy_parse_total_bytes_coded = 0;

            greedy_parse_state.m_parse_early_out_thresh = UINT_MAX;
            greedy_parse_state.m_bytes_actually_parsed = 0;

            greedy_parse_state.m_use_semaphore = false;

            if (!greedy_parse(greedy_parse_state))
            {
               if (!greedy_parse_state.m_greedy_parse_gave_up)
               {
                  LZHAM_LOG_ERROR(7052);
                  return false;
               }
            }

            uint num_greedy_decisions_to_code = 0;

            const lzham::vector<lzdecision> &best_decisions = greedy_parse_state.m_best_decisions;

            if (!greedy_parse_state.m_greedy_parse_gave_up)
               num_greedy_decisions_to_code = best_decisions.size();
            else
            {
               uint num_small_decisions = 0;
               uint total_match_len = 0;
               uint max_match_len = 0;

               uint i;
               for (i = 0; i < best_decisions.size(); i++)
               {
                  const lzdecision &dec = best_decisions[i];
                  if (dec.get_len() <= CLZBase::cMaxMatchLen)
                  {
                     num_small_decisions++;
                     if (num_small_decisions > 16)
                        break;
                  }

                  total_match_len += dec.get_len();
                  max_match_len = LZHAM_MAX(max_match_len, dec.get_len());
               }

               if (max_match_len > CLZBase::cMaxMatchLen)
               {
                  if ((total_match_len / i) >= cAvgAcceptableGreedyMatchLen)
                  {
                     num_greedy_decisions_to_code = i;
                  }
               }
            }

            if (num_greedy_decisions_to_code)
            {
               for (uint i = 0; i < num_greedy_decisions_to_code; i++)
               {
                  LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                  //LZHAM_ASSERT(i >= 0);
                  LZHAM_ASSERT(i < best_decisions.size());

#if LZHAM_UPDATE_STATS
                  bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                  m_stats.update(best_decisions[i], m_state, m_accel, cost);
#endif

                  if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                  {
                     LZHAM_LOG_ERROR(7053);
                     return false;
                  }

                  m_accel.advance_bytes(best_decisions[i].get_len());
               }

               if ((!greedy_parse_state.m_greedy_parse_gave_up) || (!bytes_to_match))
			   {
				   if (!computed_adler32)
				   {
					   computed_adler32 = true;

					   scoped_perf_section add_bytes_timer("adler32");
					   m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
				   }

                  continue;
			   }
            }
         }

         uint num_parse_jobs = LZHAM_MIN(m_num_parse_threads, (bytes_to_match + cMaxParseGraphNodes - 1) / cMaxParseGraphNodes);
         if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_DETERMINISTIC_PARSING) == 0)
         {
            if (m_use_task_pool && m_accel.get_max_helper_threads())
            {
               // Increase the number of active parse jobs as the match finder finishes up to keep CPU utilization up.
               num_parse_jobs += m_accel.get_num_completed_helper_threads();
               num_parse_jobs = LZHAM_MIN(num_parse_jobs, cMaxParseThreads);
            }
         }

         // Don't bother threading if the remaining bytes to parse is too small.
         if ((bytes_to_match < 1536) || (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_FORCE_SINGLE_THREADED_PARSING))
            num_parse_jobs = 1;

         // Update the coding statistics more frequently near the beginning of streams.
         if ((!m_block_index) && ((cur_dict_ofs - m_block_start_dict_ofs) < cMaxParseGraphNodes * 4))
            num_parse_jobs = 1;

         uint parse_thread_start_ofs = cur_dict_ofs;
         uint parse_thread_total_size = LZHAM_MIN(bytes_to_match, cMaxParseGraphNodes * num_parse_jobs);

         uint parse_thread_remaining = parse_thread_total_size;

         state_base saved_state;
         if (num_parse_jobs == 1)
            m_state.save_partial_state(saved_state);

         for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
         {
            parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

            if (num_parse_jobs == 1)
            {
               parse_thread.m_pState = &m_state;
            }
            else
            {
               parse_thread.m_pState = &parse_thread.m_state;
               parse_thread.m_state = m_state;
            }

            parse_thread.m_pState->m_cur_ofs = parse_thread_start_ofs;

            if (parse_thread_index > 0)
            {
               parse_thread.m_pState->reset_state_partial();
               parse_thread.m_issue_reset_state_partial = true;
            }
            else
            {
               parse_thread.m_issue_reset_state_partial = false;
            }

            parse_thread.m_start_ofs = parse_thread_start_ofs;
            if (parse_thread_index == (num_parse_jobs - 1))
               parse_thread.m_bytes_to_match = parse_thread_remaining;
            else
               parse_thread.m_bytes_to_match = parse_thread_total_size / num_parse_jobs;

            parse_thread.m_bytes_to_match = LZHAM_MIN(parse_thread.m_bytes_to_match, cMaxParseGraphNodes);
            LZHAM_ASSERT(parse_thread.m_bytes_to_match > 0);

            parse_thread.m_max_parse_node_states = m_params.m_extreme_parsing_max_best_arrivals;
            parse_thread.m_max_greedy_decisions = UINT_MAX;
            parse_thread.m_greedy_parse_gave_up = false;

            parse_thread.m_parse_early_out_thresh = UINT_MAX;
            parse_thread.m_bytes_actually_parsed = 0;

            parse_thread.m_use_semaphore = ((m_use_task_pool) && (num_parse_jobs > 1)) && (parse_thread_index > 0);

            if ((m_params.m_compression_level == cCompressionLevelUber) && (num_parse_jobs == 1))
            {
               // Allow the parsers to exit early if they encounter a graph bottleneck, so we can move the coding statistics forward before parsing again.
               parse_thread.m_parse_early_out_thresh = (m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_EXTREME_PARSING) ? 16 : 64;
            }

            parse_thread_start_ofs += parse_thread.m_bytes_to_match;
            parse_thread_remaining -= parse_thread.m_bytes_to_match;
         }

         {
            scoped_perf_section parse_timer("parsing");

            if ((m_use_task_pool) && (num_parse_jobs > 1))
            {
               {
                  scoped_perf_section queue_task_timer("queuing parse tasks");

                  if (!m_params.m_pTask_pool->queue_multiple_object_tasks(this, &lzcompressor::parse_job_callback, 1, num_parse_jobs - 1))
                     return false;
               }

               parse_job_callback(0, NULL);
            }
            else
            {
               for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
               {
                  parse_job_callback(parse_thread_index, NULL);
               }
            }
         }

         if (num_parse_jobs == 1)
            m_state.restore_partial_state(saved_state);

         if (!computed_adler32)
         {
            computed_adler32 = true;

            scoped_perf_section add_bytes_timer("adler32");
            m_src_adler32 = adler32(pBuf, buf_len, m_src_adler32);
         }

#define LZHAM_RELEASE_SEMAPHORES for (uint pti = 1; pti < num_parse_jobs; pti++) if (m_parse_thread_state[pti].m_use_semaphore) { m_parse_thread_state[pti].m_finished.wait(); m_parse_thread_state[pti].m_use_semaphore = false; }

         {
            scoped_perf_section coding_timer("coding");

            uint total_bytes_parsed = 0;

            for (uint parse_thread_index = 0; parse_thread_index < num_parse_jobs; parse_thread_index++)
            {
               parse_thread_state &parse_thread = m_parse_thread_state[parse_thread_index];

               if (parse_thread.m_use_semaphore)
               {
                  scoped_perf_section sect(cVarArgs, "Waiting for parser %u", parse_thread_index);
                  m_parse_thread_state[parse_thread_index].m_finished.wait();
                  m_parse_thread_state[parse_thread_index].m_use_semaphore = false;
               }

               if (parse_thread.m_failed)
               {
                  LZHAM_RELEASE_SEMAPHORES
                  LZHAM_LOG_ERROR(7054);
                  return false;
               }

               const lzham::vector<lzdecision> &best_decisions = parse_thread.m_best_decisions;

               if (parse_thread.m_issue_reset_state_partial)
               {
                  if (!m_state.encode_reset_state_partial(m_codec, m_accel, cur_dict_ofs))
                  {
                     LZHAM_RELEASE_SEMAPHORES
                     LZHAM_LOG_ERROR(7055);
                     return false;
                  }
                  m_step++;
               }

               if (best_decisions.size())
               {
                  int i = 0;
                  int end_dec_index = static_cast<int>(best_decisions.size()) - 1;
                  int dec_step = 1;
                  if (parse_thread.m_emit_decisions_backwards)
                  {
                     i = static_cast<int>(best_decisions.size()) - 1;
                     end_dec_index = 0;
                     dec_step = -1;
                     LZHAM_ASSERT(best_decisions.back().m_pos == (int)parse_thread.m_start_ofs);
                  }
                  else
                  {
                     LZHAM_ASSERT(best_decisions.front().m_pos == (int)parse_thread.m_start_ofs);
                  }

                  // Loop rearranged to avoid bad x64 codegen problem with MSVC2008.
                  for ( ; ; )
                  {
                     LZHAM_ASSERT(best_decisions[i].m_pos == (int)cur_dict_ofs);
                     LZHAM_ASSERT(i >= 0);
                     LZHAM_ASSERT(i < (int)best_decisions.size());

#if LZHAM_UPDATE_STATS
                     bit_cost_t cost = m_state.get_cost(*this, m_accel, best_decisions[i]);
                     m_stats.update(best_decisions[i], m_state, m_accel, cost);
                     //m_state.print(m_codec, *this, m_accel, best_decisions[i]);
#endif

                     if (!code_decision(best_decisions[i], cur_dict_ofs, bytes_to_match))
                     {
                        LZHAM_RELEASE_SEMAPHORES
                        LZHAM_LOG_ERROR(7056);
                        return false;
                     }

                     total_bytes_parsed += best_decisions[i].get_len();

                     if (i == end_dec_index)
                        break;
                     i += dec_step;
                  }

                  LZHAM_NOTE_UNUSED(i);
               }

               LZHAM_ASSERT(cur_dict_ofs == parse_thread.m_start_ofs + parse_thread.m_bytes_actually_parsed);

            } // parse_thread_index

            m_accel.advance_bytes(total_bytes_parsed);

         } // coding

      } // while (bytes_to_match)

      {
         scoped_perf_section add_bytes_timer("add_bytes_end");
         m_accel.add_bytes_end();
      }

      if (!m_state.encode_eob(m_codec, m_accel, cur_dict_ofs))
      {
         LZHAM_LOG_ERROR(7057);
         return false;
      }

#ifdef LZHAM_LZDEBUG
      if (!m_codec.encode_bits(366, 12))
      {
         LZHAM_LOG_ERROR(7058);
         return false;
      }
#endif

      {
         scoped_perf_section stop_encoding_timer("stop_encoding");
         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7059);
            return false;
         }
      }

      // Coded the entire block - now see if it makes more sense to just send a raw/uncompressed block.

      uint compressed_size = m_codec.get_encoding_buf().size();
      LZHAM_NOTE_UNUSED(compressed_size);

      //bool used_raw_block = false;

#if !LZHAM_FORCE_ALL_RAW_BLOCKS
   #if (defined(LZHAM_DISABLE_RAW_BLOCKS) || defined(LZHAM_LZDEBUG))
       if (0)
   #else
       // TODO: Allow the user to control this threshold, i.e. if less than 1% then just store uncompressed.
       if (compressed_size >= buf_len)
   #endif
#endif
      {
         // Failed to compress the block, so go back to our original state and just code a raw block.
         m_state = m_start_of_block_state;
         m_step = initial_step;
         //m_stats = initial_stats;

         m_codec.reset();

         if (!m_codec.start_encoding(buf_len + 16))
         {
            LZHAM_LOG_ERROR(7060);
            return false;
         }

         if (!m_block_index)
         {
            if (!send_configuration())
            {
               LZHAM_LOG_ERROR(7061);
               return false;
            }
         }

#ifdef LZHAM_LZDEBUG
         if (!m_codec.encode_bits(166, 12))
         {
            LZHAM_LOG_ERROR(7062);
            return false;
         }
#endif

         if (!m_codec.encode_bits(cRawBlock, cBlockHeaderBits))
         {
            LZHAM_LOG_ERROR(7063);
            return false;
         }

         LZHAM_ASSERT(buf_len <= 0x1000000);
         if (!m_codec.encode_bits(buf_len - 1, 24))
         {
            LZHAM_LOG_ERROR(7064);
            return false;
         }

         // Write buf len check bits, to help increase the probability of detecting corrupted data more early.
         uint buf_len0 = (buf_len - 1) & 0xFF;
         uint buf_len1 = ((buf_len - 1) >> 8) & 0xFF;
         uint buf_len2 = ((buf_len - 1) >> 16) & 0xFF;
         if (!m_codec.encode_bits((buf_len0 ^ buf_len1) ^ buf_len2, 8))
         {
            LZHAM_LOG_ERROR(7065);
            return false;
         }

         if (!m_codec.encode_align_to_byte())
         {
            LZHAM_LOG_ERROR(7066);
            return false;
         }

         const uint8* pSrc = m_accel.get_ptr(m_block_start_dict_ofs);

         for (uint i = 0; i < buf_len; i++)
         {
            if (!m_codec.encode_bits(*pSrc++, 8))
            {
               LZHAM_LOG_ERROR(7067);
               return false;
            }
         }

         if (!m_codec.stop_encoding(true))
         {
            LZHAM_LOG_ERROR(7068);
            return false;
         }

         //used_raw_block = true;
         emit_reset_update_rate_command = false;
      }

      {
         scoped_perf_section append_timer("append");

         if (m_comp_buf.empty())
         {
            m_comp_buf.swap(m_codec.get_encoding_buf());
         }
         else
         {
            if (!m_comp_buf.append(m_codec.get_encoding_buf()))
            {
               LZHAM_LOG_ERROR(7069);
               return false;
            }
         }
      }

#if LZHAM_UPDATE_STATS
      LZHAM_VERIFY(m_stats.m_total_bytes == m_src_size);
      if (emit_reset_update_rate_command)
         m_stats.m_total_update_rate_resets++;
#endif

      m_block_index++;

      return true;
   }